

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZGenGrid3D.cpp
# Opt level: O1

void __thiscall
TPZGenGrid3D::TPZGenGrid3D
          (TPZGenGrid3D *this,TPZVec<double> *minX,TPZVec<double> *maxX,TPZVec<int> *nelDiv,
          MMeshType meshType)

{
  int **ppiVar1;
  double **ppdVar2;
  double **ppdVar3;
  ulong uVar4;
  int *piVar5;
  double *pdVar6;
  int iVar7;
  int *piVar8;
  double *pdVar9;
  ostream *poVar10;
  ulong uVar11;
  size_t lineN;
  
  this->fGmesh = (TPZGeoMesh *)0x0;
  this->fMeshType = meshType;
  ppiVar1 = &(this->fNelDiv).super_TPZVec<int>.fStore;
  (this->fNelDiv).super_TPZVec<int>.fStore = (int *)0x0;
  (this->fNelDiv).super_TPZVec<int>.fNElements = 0;
  (this->fNelDiv).super_TPZVec<int>.fNAlloc = 0;
  (this->fNelDiv).super_TPZVec<int>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_018437d0;
  uVar4 = nelDiv->fNElements;
  if ((long)uVar4 < 4) {
    piVar8 = (this->fNelDiv).fExtAlloc;
    uVar11 = 0;
  }
  else {
    piVar8 = (int *)operator_new__(-(ulong)(uVar4 >> 0x3e != 0) | uVar4 * 4);
    uVar11 = uVar4;
  }
  (this->fNelDiv).super_TPZVec<int>.fStore = piVar8;
  (this->fNelDiv).super_TPZVec<int>.fNElements = uVar4;
  (this->fNelDiv).super_TPZVec<int>.fNAlloc = uVar11;
  if (0 < (long)uVar4) {
    piVar8 = nelDiv->fStore;
    piVar5 = *ppiVar1;
    uVar11 = 0;
    do {
      piVar5[uVar11] = piVar8[uVar11];
      uVar11 = uVar11 + 1;
    } while (uVar4 != uVar11);
  }
  ppdVar2 = &(this->fMinX).super_TPZVec<double>.fStore;
  (this->fMinX).super_TPZVec<double>.fStore = (double *)0x0;
  (this->fMinX).super_TPZVec<double>.fNElements = 0;
  (this->fMinX).super_TPZVec<double>.fNAlloc = 0;
  (this->fMinX).super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01841aa0;
  uVar4 = minX->fNElements;
  if ((long)uVar4 < 4) {
    pdVar9 = (this->fMinX).fExtAlloc;
    uVar11 = 0;
  }
  else {
    pdVar9 = (double *)operator_new__(-(ulong)(uVar4 >> 0x3d != 0) | uVar4 * 8);
    uVar11 = uVar4;
  }
  (this->fMinX).super_TPZVec<double>.fStore = pdVar9;
  (this->fMinX).super_TPZVec<double>.fNElements = uVar4;
  (this->fMinX).super_TPZVec<double>.fNAlloc = uVar11;
  if (0 < (long)uVar4) {
    pdVar9 = minX->fStore;
    pdVar6 = *ppdVar2;
    uVar11 = 0;
    do {
      pdVar6[uVar11] = pdVar9[uVar11];
      uVar11 = uVar11 + 1;
    } while (uVar4 != uVar11);
  }
  ppdVar3 = &(this->fMaxX).super_TPZVec<double>.fStore;
  (this->fMaxX).super_TPZVec<double>.fStore = (double *)0x0;
  (this->fMaxX).super_TPZVec<double>.fNElements = 0;
  (this->fMaxX).super_TPZVec<double>.fNAlloc = 0;
  (this->fMaxX).super_TPZVec<double>._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_01841aa0;
  uVar4 = maxX->fNElements;
  if ((long)uVar4 < 4) {
    pdVar9 = (this->fMaxX).fExtAlloc;
    uVar11 = 0;
  }
  else {
    pdVar9 = (double *)operator_new__(-(ulong)(uVar4 >> 0x3d != 0) | uVar4 * 8);
    uVar11 = uVar4;
  }
  (this->fMaxX).super_TPZVec<double>.fStore = pdVar9;
  (this->fMaxX).super_TPZVec<double>.fNElements = uVar4;
  (this->fMaxX).super_TPZVec<double>.fNAlloc = uVar11;
  if (0 < (long)uVar4) {
    pdVar9 = maxX->fStore;
    pdVar6 = *ppdVar3;
    uVar11 = 0;
    do {
      pdVar6[uVar11] = pdVar9[uVar11];
      uVar11 = uVar11 + 1;
    } while (uVar4 != uVar11);
  }
  if ((((this->fMinX).super_TPZVec<double>.fNElements == 3) &&
      ((this->fMaxX).super_TPZVec<double>.fNElements == 3)) &&
     ((this->fNelDiv).super_TPZVec<int>.fNElements == 3)) {
    iVar7 = MMeshType_Dimension(this->fMeshType);
    if (iVar7 == 3) {
      piVar8 = *ppiVar1;
      if (((*piVar8 < 1) || (piVar8[1] < 1)) || (piVar8[2] < 1)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "TPZGenGrid3D::TPZGenGrid3D(const TPZVec<REAL> &, const TPZVec<REAL> &, const TPZVec<int> &, const MMeshType)"
                   ,0x6c);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," error\n",7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,
                   "The read number of grid divisions is not allowed. The parameters are:\n",0x46);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"nel x: ",7);
        poVar10 = (ostream *)std::ostream::operator<<(&std::cerr,**ppiVar1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"nel y: ",7);
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,(*ppiVar1)[1]);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"nel z: ",7);
        poVar10 = (ostream *)std::ostream::operator<<(poVar10,(*ppiVar1)[2]);
        lineN = 0x23;
        std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
      }
      else {
        pdVar9 = *ppdVar3;
        if (((*pdVar9 < 1e-12) || (pdVar9[1] < 1e-12)) || (pdVar9[2] < 1e-12)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "TPZGenGrid3D::TPZGenGrid3D(const TPZVec<REAL> &, const TPZVec<REAL> &, const TPZVec<int> &, const MMeshType)"
                     ,0x6c);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," error\n",7);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Dimensions of grid not allowed. The parameters are:\n",
                     0x34);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"max x: ",7);
          poVar10 = std::ostream::_M_insert<double>(**ppdVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"max y: ",7);
          poVar10 = std::ostream::_M_insert<double>((*ppdVar3)[1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"max z: ",7);
          poVar10 = std::ostream::_M_insert<double>((*ppdVar3)[2]);
          lineN = 0x28;
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
        }
        else {
          pdVar6 = *ppdVar2;
          if (((*pdVar6 <= *pdVar9) && (pdVar6[1] <= pdVar9[1])) && (pdVar6[2] <= pdVar9[2])) {
            return;
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,
                     "TPZGenGrid3D::TPZGenGrid3D(const TPZVec<REAL> &, const TPZVec<REAL> &, const TPZVec<int> &, const MMeshType)"
                     ,0x6c);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," error\n",7);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Dimensions of grid not allowed. The parameters are:\n",
                     0x34);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"min x: ",7);
          poVar10 = std::ostream::_M_insert<double>(**ppdVar2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"min y: ",7);
          poVar10 = std::ostream::_M_insert<double>((*ppdVar2)[1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"min z: ",7);
          poVar10 = std::ostream::_M_insert<double>((*ppdVar2)[2]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"max x: ",7);
          poVar10 = std::ostream::_M_insert<double>(**ppdVar3);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"max y: ",7);
          poVar10 = std::ostream::_M_insert<double>((*ppdVar3)[1]);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"max z: ",7);
          poVar10 = std::ostream::_M_insert<double>((*ppdVar3)[2]);
          lineN = 0x2f;
          std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
        }
      }
    }
    else {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,
                 "TPZGenGrid3D::TPZGenGrid3D(const TPZVec<REAL> &, const TPZVec<REAL> &, const TPZVec<int> &, const MMeshType)"
                 ,0x6c);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," error\n",7);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Element type ",0xd);
      poVar10 = ::operator<<((ostream *)&std::cerr,this->fMeshType);
      lineN = 0x1d;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar10," is not supported. Aborting...\n",0x1f);
    }
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZGenGrid3D.cpp"
               ,lineN);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,
             "TPZGenGrid3D::TPZGenGrid3D(const TPZVec<REAL> &, const TPZVec<REAL> &, const TPZVec<int> &, const MMeshType)"
             ,0x6c);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr," error\n",7);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cerr,"minX, maxX and nelDiv must have size = 3!\n",0x2a);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"size(minX) = ",0xd);
  poVar10 = std::ostream::_M_insert<long>((long)&std::cerr);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"size(maxX) = ",0xd);
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"size(nelDiv) = ",0xf);
  poVar10 = std::ostream::_M_insert<long>((long)poVar10);
  std::__ostream_insert<char,std::char_traits<char>>(poVar10,"\n",1);
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Pre/TPZGenGrid3D.cpp"
             ,0x18);
}

Assistant:

TPZGenGrid3D::TPZGenGrid3D(const TPZVec<REAL> &minX, const TPZVec<REAL> &maxX, const TPZVec<int> &nelDiv, const MMeshType meshType)
                           :fGmesh{nullptr}, fMinX{minX}, fMaxX{maxX},fNelDiv{nelDiv},fMeshType{meshType}{
    const REAL tol{ZeroTolerance()};
    if(fMinX.NElements() != 3 || fMaxX.NElements() != 3 || fNelDiv.NElements() != 3){
        PZError<<__PRETTY_FUNCTION__<<" error\n";
        PZError<<"minX, maxX and nelDiv must have size = 3!\n";
        PZError<<"size(minX) = "<<fMinX.NElements()<<"\n"
               <<"size(maxX) = "<<fMaxX.NElements()<<"\n"
               <<"size(nelDiv) = "<<fNelDiv.NElements()<<"\n";
        DebugStop();
    }
    if(MMeshType_Dimension(fMeshType) != fDim){
        PZError<<__PRETTY_FUNCTION__<<" error\n";
        PZError<<"Element type "<<fMeshType<<" is not supported. Aborting...\n";
        DebugStop();
    }
    else if(fNelDiv[0] < 1 || fNelDiv[1] < 1 || fNelDiv[2] < 1){
        PZError<<__PRETTY_FUNCTION__<<" error\n";
        PZError<<"The read number of grid divisions is not allowed. The parameters are:\n";
        PZError<<"nel x: "<<fNelDiv[0]<<"\n"<<"nel y: "<<fNelDiv[1]<<"\n"<<"nel z: "<<fNelDiv[2]<<"\n";
        DebugStop();
    }else if(fMaxX[0] < tol || fMaxX[1] < tol || fMaxX[2] < tol){
        PZError<<__PRETTY_FUNCTION__<<" error\n";
        PZError<<"Dimensions of grid not allowed. The parameters are:\n";
        PZError<<"max x: "<<fMaxX[0]<<"\n"<<"max y: "<<fMaxX[1]<<"\n"<<"max z: "<<fMaxX[2]<<"\n";
        DebugStop();
    }
    else if(fMaxX[0] < fMinX[0] || fMaxX[1] < fMinX[1] || fMaxX[2] < fMinX[2]){
        PZError<<__PRETTY_FUNCTION__<<" error\n";
        PZError<<"Dimensions of grid not allowed. The parameters are:\n";
        PZError<<"min x: "<<fMinX[0]<<"\n"<<"min y: "<<fMinX[1]<<"\n"<<"min z: "<<fMinX[2]<<"\n";
        PZError<<"max x: "<<fMaxX[0]<<"\n"<<"max y: "<<fMaxX[1]<<"\n"<<"max z: "<<fMaxX[2]<<"\n";
        DebugStop();
    }
}